

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double derivative_in_direction<dense_parameters>
                 (vw *param_1,bfgs *b,float *mem,int *origin,dense_parameters *weights)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  float *pfVar5;
  int *in_RCX;
  int __c;
  long in_RDX;
  long in_RSI;
  dense_iterator<float> *rhs;
  dense_parameters *in_R8;
  float *mem1;
  iterator w;
  double ret;
  dense_parameters *in_stack_ffffffffffffff90;
  dense_iterator<float> local_60;
  dense_iterator<float> local_48;
  double local_30;
  dense_parameters *local_28;
  int *local_20;
  long local_18;
  long local_10;
  
  local_30 = 0.0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  dense_parameters::begin(in_stack_ffffffffffffff90);
  while( true ) {
    dense_parameters::end(in_stack_ffffffffffffff90);
    rhs = &local_60;
    bVar2 = dense_iterator<float>::operator!=(&local_48,rhs);
    lVar1 = local_18;
    if (!bVar2) break;
    pcVar4 = dense_iterator<float>::index(&local_48,(char *)rhs,__c);
    uVar3 = dense_parameters::stride_shift(local_28);
    in_stack_ffffffffffffff90 =
         (dense_parameters *)
         (double)*(float *)(lVar1 + ((ulong)pcVar4 >> ((byte)uVar3 & 0x3f)) *
                                    (long)*(int *)(local_10 + 0xb4) * 4 +
                           (long)(*local_20 % *(int *)(local_10 + 0xb4)) * 4);
    pfVar5 = dense_iterator<float>::operator*(&local_48);
    local_30 = (double)in_stack_ffffffffffffff90 * (double)pfVar5[2] + local_30;
    dense_iterator<float>::operator++(&local_48);
  }
  return local_30;
}

Assistant:

double derivative_in_direction(vw& /* all */, bfgs& b, float* mem, int& origin, T& weights)
{
  double ret = 0.;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    ret += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * (&(*w))[W_DIR];
  }
  return ret;
}